

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

UInt32 Hc4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  CLzRef CVar3;
  byte *cur;
  CLzRef *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  UInt32 UVar8;
  UInt32 *pUVar9;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  UInt32 UVar13;
  long lVar14;
  uint uVar15;
  UInt32 maxLen;
  ulong uVar16;
  
  lenLimit = p->lenLimit;
  if ((ulong)lenLimit < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar10 = (uint)cur[1] ^ p->crc[*cur];
  uVar6 = (uint)cur[2] << 8 ^ uVar10;
  uVar10 = uVar10 & 0x3ff;
  uVar11 = (ulong)(uVar6 & 0xffff);
  pCVar4 = p->hash;
  CVar1 = p->pos;
  CVar2 = pCVar4[uVar10];
  uVar15 = CVar1 - CVar2;
  CVar3 = pCVar4[uVar11 + 0x400];
  uVar6 = ((p->crc[cur[3]] << 5 ^ uVar6) & p->hashMask) + 0x10400;
  UVar8 = pCVar4[uVar6];
  pCVar4[uVar10] = CVar1;
  pCVar4[uVar11 + 0x400] = CVar1;
  pCVar4[uVar6] = CVar1;
  uVar6 = 0;
  bVar5 = true;
  uVar11 = (ulong)uVar15;
  if ((uVar15 < p->cyclicBufferSize) && (cur[-uVar11] == *cur)) {
    *distances = 2;
    distances[1] = uVar15 - 1;
    uVar6 = 2;
    bVar5 = false;
  }
  if (((CVar3 == CVar2) || (uVar10 = CVar1 - CVar3, p->cyclicBufferSize <= uVar10)) ||
     (cur[-(ulong)uVar10] != *cur)) {
    UVar13 = 0;
    uVar10 = 0;
    if (!bVar5) {
      uVar16 = (ulong)uVar6;
      UVar13 = uVar6;
      goto LAB_00110873;
    }
  }
  else {
    distances[(ulong)uVar6 + 1] = uVar10 - 1;
    uVar16 = 3;
    uVar11 = (ulong)uVar10;
    UVar13 = uVar6 + 2;
LAB_00110873:
    pbVar12 = cur + uVar16;
    iVar7 = (int)cur + lenLimit;
    for (lVar14 = lenLimit - uVar16; lVar14 != 0; lVar14 = lVar14 + -1) {
      if (pbVar12[-uVar11] != *pbVar12) {
        iVar7 = (int)pbVar12;
        break;
      }
      pbVar12 = pbVar12 + 1;
    }
    uVar10 = iVar7 - (int)cur;
    distances[UVar13 - 2] = uVar10;
    if (lenLimit == uVar10) {
      p->son[p->cyclicBufferPos] = UVar8;
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = cur + 1;
      goto LAB_00110905;
    }
  }
  maxLen = 3;
  if (3 < uVar10) {
    maxLen = uVar10;
  }
  pUVar9 = Hc_GetMatchesSpec(lenLimit,UVar8,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize
                             ,p->cutValue,distances + UVar13,maxLen);
  UVar13 = (UInt32)((ulong)((long)pUVar9 - (long)distances) >> 2);
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
LAB_00110905:
  UVar8 = p->pos + 1;
  p->pos = UVar8;
  if (UVar8 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar13;
}

Assistant:

static UInt32 Hc4_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, h3, d2, d3, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  hash = p->hash;
  pos = p->pos;
  
  d2 = pos - hash[                h2];
  d3 = pos - hash[kFix3HashSize + h3];
  
  curMatch = hash[kFix4HashSize + hv];

  hash[                h2] = pos;
  hash[kFix3HashSize + h3] = pos;
  hash[kFix4HashSize + hv] = pos;

  maxLen = 0;
  offset = 0;

  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    distances[0] = maxLen = 2;
    distances[1] = d2 - 1;
    offset = 2;
  }
  
  if (d2 != d3 && d3 < p->cyclicBufferSize && *(cur - d3) == *cur)
  {
    maxLen = 3;
    distances[offset + 1] = d3 - 1;
    offset += 2;
    d2 = d3;
  }
  
  if (offset != 0)
  {
    UPDATE_maxLen
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit)
    {
      p->son[p->cyclicBufferPos] = curMatch;
      MOVE_POS_RET;
    }
  }
  
  if (maxLen < 3)
    maxLen = 3;

  offset = (UInt32)(Hc_GetMatchesSpec(lenLimit, curMatch, MF_PARAMS(p),
      distances + offset, maxLen) - (distances));
  MOVE_POS_RET
}